

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O1

pair<const_int_*,_unsigned_long> __thiscall
poplar::compact_bonsai_nlm<int,_64UL>::compare
          (compact_bonsai_nlm<int,_64UL> *this,uint64_t pos,char_range *key)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _Head_base<0UL,_unsigned_char_*,_false> _Var4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  pair<const_int_*,_unsigned_long> pVar12;
  pair<const_int_*,_unsigned_long> pVar13;
  
  _Var4._M_head_impl =
       *(uchar **)
        &(this->ptrs_).
         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[pos >> 6]._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
  uVar5 = ~(-1L << (pos & 0x3f)) &
          (this->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[pos >> 6];
  if (uVar5 != 0) {
    lVar6 = POPCOUNT(uVar5);
    lVar9 = 0;
    do {
      bVar11 = *_Var4._M_head_impl;
      lVar10 = 1;
      if ((char)bVar11 < '\0') {
        uVar7 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 | (ulong)(bVar11 & 0x7f) << (uVar7 & 0x3f);
          uVar7 = uVar7 + 7;
          bVar11 = *(byte *)((long)_Var4._M_head_impl + lVar10);
          lVar10 = lVar10 + 1;
        } while ((char)bVar11 < '\0');
      }
      else {
        uVar5 = 0;
        uVar7 = 0;
      }
      _Var4._M_head_impl = _Var4._M_head_impl + ((ulong)bVar11 << (uVar7 & 0x3f) | uVar5) + lVar10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar6 + (ulong)(lVar6 == 0));
  }
  bVar11 = *_Var4._M_head_impl;
  lVar6 = 1;
  if ((char)bVar11 < '\0') {
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 | (ulong)(bVar11 & 0x7f) << (uVar7 & 0x3f);
      uVar7 = uVar7 + 7;
      bVar11 = *(byte *)((long)_Var4._M_head_impl + lVar6);
      lVar6 = lVar6 + 1;
    } while ((char)bVar11 < '\0');
  }
  else {
    uVar5 = 0;
    uVar7 = 0;
  }
  pVar12.first = (byte *)((long)_Var4._M_head_impl + lVar6);
  puVar1 = key->begin;
  if (puVar1 == key->end) {
    pVar12.second = 0;
    return pVar12;
  }
  uVar5 = (ulong)bVar11 << (uVar7 & 0x3f) | uVar5;
  uVar7 = uVar5 - 4;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      if (puVar1[uVar8] != pVar12.first[uVar8]) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar8;
        return (pair<const_int_*,_unsigned_long>)(auVar3 << 0x40);
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (puVar1[uVar7] != '\0') {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar7;
    return (pair<const_int_*,_unsigned_long>)(auVar2 << 0x40);
  }
  pVar13.first = pVar12.first + uVar7;
  pVar13.second = uVar5 - 3;
  return pVar13;
}

Assistant:

std::pair<const value_type*, uint64_t> compare(uint64_t pos, const char_range& key) const {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        assert(ptrs_[chunk_id]);
        assert(bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk));

        const uint8_t* ptr = ptrs_[chunk_id].get();
        const uint64_t offset = bit_tools::popcnt(chunks_[chunk_id], pos_in_chunk);

        uint64_t alloc = 0;
        for (uint64_t i = 0; i < offset; ++i) {
            ptr += vbyte::decode(ptr, alloc);
            ptr += alloc;
        }
        ptr += vbyte::decode(ptr, alloc);

        if (key.empty()) {
            return {reinterpret_cast<const value_type*>(ptr), 0};
        }

        uint64_t length = alloc - sizeof(value_type);
        for (uint64_t i = 0; i < length; ++i) {
            if (key[i] != ptr[i]) {
                return {nullptr, i};
            }
        }

        if (key[length] != '\0') {
            return {nullptr, length};
        }

        // +1 considers the terminator '\0'
        return {reinterpret_cast<const value_type*>(ptr + length), length + 1};
    }